

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O0

ssize_t __thiscall
avro::anon_unknown_3::FileBufferCopyOut::write
          (FileBufferCopyOut *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int *piVar2;
  undefined4 in_register_00000034;
  char **in_stack_fffffffffffffed8;
  format *in_stack_ffffffffffffff18;
  Exception *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff48;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  
  sVar1 = ::write(this->fd_,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
  if (sVar1 < 0) {
    this_00 = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x18);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    piVar2 = __errno_location();
    strerror(*piVar2);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
              (this_00,in_stack_fffffffffffffed8);
    Exception::Exception(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return sVar1;
}

Assistant:

void write(const uint8_t* b, size_t len) {
        if (::write(fd_, b, len) < 0) {
            throw Exception(boost::format("Cannot write file: %1%") %
                ::strerror(errno));
        }
    }